

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O2

ZyanStatus
ZyanVectorInitEx(ZyanVector *vector,ZyanUSize element_size,ZyanUSize capacity,
                ZyanMemberProcedure destructor,ZyanAllocator *allocator,ZyanU8 growth_factor,
                ZyanU8 shrink_threshold)

{
  ZyanAllocatorAllocate UNRECOVERED_JUMPTABLE;
  ZyanStatus ZVar1;
  ZyanUSize ZVar2;
  undefined3 in_register_00000089;
  
  if ((CONCAT31(in_register_00000089,growth_factor) == 0 || allocator == (ZyanAllocator *)0x0) ||
      (element_size == 0 || vector == (ZyanVector *)0x0)) {
    return 0x80100004;
  }
  UNRECOVERED_JUMPTABLE = allocator->allocate;
  if (UNRECOVERED_JUMPTABLE != (ZyanAllocatorAllocate)0x0) {
    vector->allocator = allocator;
    vector->growth_factor = growth_factor;
    vector->shrink_threshold = shrink_threshold;
    vector->size = 0;
    ZVar2 = capacity + (capacity == 0);
    vector->capacity = ZVar2;
    vector->element_size = element_size;
    vector->destructor = destructor;
    vector->data = (void *)0x0;
    ZVar1 = (*UNRECOVERED_JUMPTABLE)(allocator,&vector->data,element_size,ZVar2);
    return ZVar1;
  }
  __assert_fail("allocator->allocate",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                ,0xc9,
                "ZyanStatus ZyanVectorInitEx(ZyanVector *, ZyanUSize, ZyanUSize, ZyanMemberProcedure, ZyanAllocator *, ZyanU8, ZyanU8)"
               );
}

Assistant:

ZyanStatus ZyanVectorInitEx(ZyanVector* vector, ZyanUSize element_size, ZyanUSize capacity,
    ZyanMemberProcedure destructor, ZyanAllocator* allocator, ZyanU8 growth_factor,
    ZyanU8 shrink_threshold)
{
    if (!vector || !element_size || !allocator || (growth_factor < 1))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_ASSERT(allocator->allocate);

    vector->allocator        = allocator;
    vector->growth_factor    = growth_factor;
    vector->shrink_threshold = shrink_threshold;
    vector->size             = 0;
    vector->capacity         = ZYAN_MAX(ZYAN_VECTOR_MIN_CAPACITY, capacity);
    vector->element_size     = element_size;
    vector->destructor       = destructor;
    vector->data             = ZYAN_NULL;

    return allocator->allocate(vector->allocator, &vector->data, vector->element_size,
        vector->capacity);
}